

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

bool __thiscall
cmGhsMultiTargetGenerator::VisitCustomCommand
          (cmGhsMultiTargetGenerator *this,
          set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *temp,set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *perm,vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order,
          cmSourceFile *si)

{
  _Rb_tree_header *p_Var1;
  pointer *pppcVar2;
  pointer pbVar3;
  iterator __position;
  bool bVar4;
  _Base_ptr p_Var5;
  cmCustomCommand *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  cmLocalGenerator *this_01;
  cmSourceFile *si_00;
  _Base_ptr p_Var7;
  pointer name;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar8;
  cmSourceFile *local_38;
  
  p_Var5 = (perm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(perm->_M_t)._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cmSourceFile **)(p_Var5 + 1) >= si) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(cmSourceFile **)(p_Var5 + 1) < si];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(cmSourceFile **)(p_Var7 + 1) <= si)) {
      return false;
    }
  }
  local_38 = si;
  pVar8 = std::
          _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
          ::_M_insert_unique<cmSourceFile_const*const&>
                    ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                      *)temp,&local_38);
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return true;
  }
  this_00 = cmSourceFile::GetCustomCommand(local_38);
  pvVar6 = cmCustomCommand::GetDepends_abi_cxx11_(this_00);
  name = (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (name == pbVar3) {
      std::
      _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
      ::_M_insert_unique<cmSourceFile_const*const&>
                ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                  *)perm,&local_38);
      __position._M_current =
           (order->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (order->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
        _M_realloc_insert<cmSourceFile_const*const&>
                  ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)order,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppcVar2 = &(order->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar2 = *pppcVar2 + 1;
      }
      return false;
    }
    this_01 = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
    si_00 = cmLocalGenerator::GetSourceFileWithOutput(this_01,name,OutputOnly);
    if ((si_00 != (cmSourceFile *)0x0) &&
       (bVar4 = VisitCustomCommand(this,temp,perm,order,si_00), bVar4)) break;
    name = name + 1;
  }
  return true;
}

Assistant:

bool cmGhsMultiTargetGenerator::VisitCustomCommand(
  std::set<cmSourceFile const*>& temp, std::set<cmSourceFile const*>& perm,
  std::vector<cmSourceFile const*>& order, cmSourceFile const* si)
{
  /* check if permanent mark is set*/
  if (perm.find(si) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(si).second) {
      for (const auto& di : si->GetCustomCommand()->GetDepends()) {
        cmSourceFile const* sf =
          this->GeneratorTarget->GetLocalGenerator()->GetSourceFileWithOutput(
            di);
        /* if sf exists then visit */
        if (sf && this->VisitCustomCommand(temp, perm, order, sf)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(si);
      order.push_back(si);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}